

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::
EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
::operator()(AssertionResult *__return_storage_ptr__,
            EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
            *this,vector<int,_std::allocator<int>_> *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string local_78;
  AssertionResult local_58;
  int *local_30;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *actual_local;
  EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_>_>
  *this_local;
  
  local_20 = actual;
  actual_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (EachMatcher<iutest::detail::AllOfMatcher<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_>_>
                *)__return_storage_ptr__;
  local_28._M_current = (int *)std::begin<std::vector<int,std::allocator<int>>>(actual);
  local_30 = (int *)std::end<std::vector<int,std::allocator<int>>>(local_20);
  bVar1 = Each<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    (this,local_28,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_30);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_78,this);
    rhs = AssertionResult::operator<<(&local_58,&local_78);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_78);
    AssertionResult::~AssertionResult(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Each(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }